

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void test_ecmult_multi_batch_single(secp256k1_ecmult_multi_func ecmult_multi)

{
  int iVar1;
  secp256k1_scratch *scratch;
  secp256k1_scalar *inp_g_sc;
  secp256k1_gej *r_00;
  secp256k1_scratch *scratch_00;
  secp256k1_callback *error_callback;
  code *cb;
  secp256k1_scalar **cbdata;
  ecmult_multi_data data;
  secp256k1_scalar sc;
  secp256k1_ge pt;
  secp256k1_gej r;
  secp256k1_scalar *local_150;
  secp256k1_ge *local_148;
  secp256k1_scalar local_140;
  secp256k1_ge local_120;
  secp256k1_gej local_b8;
  
  random_group_element_test(&local_120);
  random_scalar_order(&local_140);
  cbdata = &local_150;
  local_150 = &local_140;
  local_148 = &local_120;
  scratch = secp256k1_scratch_create(&CTX->error_callback,0);
  error_callback = &CTX->error_callback;
  inp_g_sc = &secp256k1_scalar_zero;
  cb = ecmult_multi_callback;
  scratch_00 = scratch;
  iVar1 = (*ecmult_multi)(error_callback,scratch,&local_b8,&secp256k1_scalar_zero,
                          ecmult_multi_callback,cbdata,1);
  if (iVar1 == 0) {
    secp256k1_scratch_destroy(&CTX->error_callback,scratch);
    return;
  }
  test_ecmult_multi_batch_single_cold_1();
  secp256k1_ecmult_strauss_batch
            (error_callback,scratch_00,r_00,inp_g_sc,cb,cbdata,(size_t)local_150,0);
  return;
}

Assistant:

static void test_ecmult_multi_batch_single(secp256k1_ecmult_multi_func ecmult_multi) {
    secp256k1_scalar sc;
    secp256k1_ge pt;
    secp256k1_gej r;
    ecmult_multi_data data;
    secp256k1_scratch *scratch_empty;

    random_group_element_test(&pt);
    random_scalar_order(&sc);
    data.sc = &sc;
    data.pt = &pt;

    /* Try to multiply 1 point, but scratch space is empty.*/
    scratch_empty = secp256k1_scratch_create(&CTX->error_callback, 0);
    CHECK(!ecmult_multi(&CTX->error_callback, scratch_empty, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 1));
    secp256k1_scratch_destroy(&CTX->error_callback, scratch_empty);
}